

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::semicolon(Forth *this)

{
  Definition *this_00;
  Forth *this_local;
  
  data(this,3);
  data(this,4);
  setIsCompiling(this,this->False);
  this_00 = lastDefinition(this);
  Definition::toggleHidden(this_00);
  std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>::
  clear(&this->localVariables);
  return;
}

Assistant:

void semicolon() {
			data(CELL(exitXt));
			data(CELL(endOfDefinitionXt));
			setIsCompiling( False );
			lastDefinition().toggleHidden(); // @bug lastDefinition can be not last if compilation created additional definitions
			/// 13.3.3.1 These temporary dictionary entries shall vanish at the end of the definition, 
			/// denoted by ; (semicolon), ;CODE, or DOES>. 
			localVariables.clear();
		}